

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

size_t ma_dr_wav__on_read_memory(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  ulong uVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t bytesRemaining;
  ma_dr_wav *pWav;
  undefined8 local_18;
  
  uVar1 = *(long *)(in_RDI + 200) - *(long *)(in_RDI + 0xd0);
  local_18 = in_RDX;
  if (uVar1 < in_RDX) {
    local_18 = uVar1;
  }
  if (local_18 != 0) {
    memcpy(in_RSI,(void *)(*(long *)(in_RDI + 0xc0) + *(long *)(in_RDI + 0xd0)),local_18);
    *(ulong *)(in_RDI + 0xd0) = local_18 + *(long *)(in_RDI + 0xd0);
  }
  return local_18;
}

Assistant:

MA_PRIVATE size_t ma_dr_wav__on_read_memory(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    ma_dr_wav* pWav = (ma_dr_wav*)pUserData;
    size_t bytesRemaining;
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(pWav->memoryStream.dataSize >= pWav->memoryStream.currentReadPos);
    bytesRemaining = pWav->memoryStream.dataSize - pWav->memoryStream.currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }
    if (bytesToRead > 0) {
        MA_DR_WAV_COPY_MEMORY(pBufferOut, pWav->memoryStream.data + pWav->memoryStream.currentReadPos, bytesToRead);
        pWav->memoryStream.currentReadPos += bytesToRead;
    }
    return bytesToRead;
}